

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O3

ItemFlags __thiscall
QConcatenateTablesProxyModel::flags(QConcatenateTablesProxyModel *this,QModelIndex *index)

{
  long *plVar1;
  QFlagsStorage<Qt::ItemFlag> QVar2;
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar3;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(this + 8) + 0xe8) == 0) {
    QVar2.i = 0;
  }
  else {
    if (((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) {
      plVar1 = (long *)**(undefined8 **)(*(long *)(this + 8) + 0xe0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QVar3.super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)(**(code **)(*plVar1 + 0x138))(plVar1,index);
        return (QFlagsStorageHelper<Qt::ItemFlag,_4>)
               (QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i;
      }
      goto LAB_0046b7d2;
    }
    local_18.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    mapToSource((QModelIndex *)&local_28,this,index);
    QVar2.i = (*((local_18.ptr)->super_QObject)._vptr_QObject[0x27])(local_18.ptr,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar2.i;
  }
LAB_0046b7d2:
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QConcatenateTablesProxyModel::flags(const QModelIndex &index) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_models.isEmpty())
        return Qt::NoItemFlags;
    Q_ASSERT(checkIndex(index));
    if (!index.isValid())
        return d->m_models.at(0).model->flags(index);
    const QModelIndex sourceIndex = mapToSource(index);
    Q_ASSERT(sourceIndex.isValid());
    return sourceIndex.model()->flags(sourceIndex);
}